

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

int connection_get_max_frame_size(CONNECTION_HANDLE connection,uint32_t *max_frame_size)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  uint32_t *max_frame_size_local;
  CONNECTION_HANDLE connection_local;
  
  if ((connection == (CONNECTION_HANDLE)0x0) || (max_frame_size == (uint32_t *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"connection_get_max_frame_size",0x5d9,1,
                "Bad arguments: connection = %p, max_frame_size = %p",connection,max_frame_size);
    }
    l._4_4_ = 0x5da;
  }
  else {
    *max_frame_size = connection->max_frame_size;
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int connection_get_max_frame_size(CONNECTION_HANDLE connection, uint32_t* max_frame_size)
{
    int result;

    /* Codes_S_R_S_CONNECTION_01_170: [If connection or max_frame_size is NULL, connection_get_max_frame_size shall fail and return a non-zero value.] */
    if ((connection == NULL) ||
        (max_frame_size == NULL))
    {
        LogError("Bad arguments: connection = %p, max_frame_size = %p",
            connection, max_frame_size);
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_S_R_S_CONNECTION_01_168: [connection_get_max_frame_size shall return in the max_frame_size argument the current max frame size setting.] */
        *max_frame_size = connection->max_frame_size;

        /* Codes_S_R_S_CONNECTION_01_169: [On success, connection_get_max_frame_size shall return 0.] */
        result = 0;
    }

    return result;
}